

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O2

void bitrev_init(int n,int *rho)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  if (n == 1) {
    *rho = 0;
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < n) {
      uVar2 = (ulong)(uint)n;
    }
    for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
      iVar3 = 0;
      uVar5 = uVar1 & 0xffffffff;
      for (iVar4 = 1; iVar4 < n; iVar4 = iVar4 * 2) {
        uVar6 = (uint)uVar5;
        uVar5 = uVar5 >> 1;
        iVar3 = (uVar6 & 1) + iVar3 * 2;
      }
      rho[uVar1] = iVar3;
    }
  }
  return;
}

Assistant:

void bitrev_init(int n, int *rho)
    {
    int j;
    int n1, rem, val, k, lastbit, one=1;

    if (n==1)
        {
        rho[0]= 0;
        return;
        }
    n1= n;
    for(j=0; j<n; j++)
        {
        rem= j; 
        val= 0;
        for (k=1; k<n1; k <<= 1)
            {
            lastbit= rem & one;
            rem >>= 1;
            val <<= 1;
            val |= lastbit;
            }
        rho[j]= (int)val;
        }
   }